

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::ParameterizedTestFactory<crc32_variant_braid_Test>::CreateTest
          (ParameterizedTestFactory<crc32_variant_braid_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<crc32_test>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_0019e378;
  this_00[1]._vptr_Test = (_func_int **)&PTR__crc32_variant_braid_Test_0019e3b8;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }